

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
          Msg<google::protobuf::json_internal::ParseProto3Type> *msg,bool any_reparse)

{
  uint uVar1;
  undefined4 uVar2;
  Type TVar3;
  iterator iVar4;
  uint8_t *puVar5;
  pointer pcVar6;
  size_t sVar7;
  long lVar8;
  undefined1 auVar9 [8];
  ZeroCopyInputStream *pZVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  MessageType MVar14;
  size_t *psVar15;
  Status SVar16;
  undefined7 extraout_var;
  string *psVar17;
  Msg<google::protobuf::json_internal::ParseProto3Type> *pMVar18;
  int *piVar19;
  Msg *pMVar20;
  uintptr_t extraout_RAX;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar21;
  uintptr_t extraout_RAX_00;
  uintptr_t extraout_RAX_01;
  Field pFVar22;
  uintptr_t extraout_RAX_02;
  uintptr_t extraout_RAX_03;
  uintptr_t extraout_RAX_04;
  uintptr_t extraout_RAX_05;
  undefined8 uVar23;
  char *pcVar24;
  char *pcVar25;
  undefined8 *puVar26;
  int iVar27;
  Status *_status_1;
  undefined7 in_register_00000081;
  pointer *ppCVar28;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  *this_00;
  MessagePath *pMVar29;
  Status *_status;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> SVar30;
  string_view sVar31;
  string_view literal;
  string_view name;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  string_view x;
  string_view x_00;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  optional<google::protobuf::json_internal::MaybeOwnedString> type_url;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  undefined1 local_190 [8];
  undefined1 auStack_188 [88];
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  size_t local_120;
  MessagePath *local_118;
  MessagePath *local_110;
  JsonLocation *local_108;
  JsonLocation *local_100;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_f8;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  _Stack_f0;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_c0;
  undefined1 local_a0 [48];
  bool local_70;
  ZeroCopyInputStream *local_68;
  Status local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  psVar15 = (size_t *)
            ((ulong)(desc->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  sVar31._M_str = (char *)desc;
  sVar31._M_len = *psVar15;
  pcVar24 = (char *)CONCAT71(in_register_00000081,any_reparse);
  MVar14 = ClassifyMessage((json_internal *)psVar15[1],sVar31);
  iVar27 = (int)(char *)CONCAT71(in_register_00000081,any_reparse);
  local_100 = (JsonLocation *)CONCAT44(local_100._4_4_,iVar27);
  if (iVar27 != 0) {
switchD_002bc764_caseD_3:
    SVar16 = JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
    if (*(long *)this != 1) {
      return (Status)SVar16.rep_;
    }
    iVar27 = (lex->options_).recursion_depth;
    if (iVar27 == 0) {
      SVar16 = JsonLocation::Invalid
                         ((JsonLocation *)this,&lex->json_loc_,0x22,
                          "JSON content was too deeply nested");
      if (*(long *)this != 1) {
        return (Status)SVar16.rep_;
      }
    }
    else {
      (lex->options_).recursion_depth = iVar27 + -1;
      *(undefined8 *)this = 1;
    }
    literal._M_str = "}";
    literal._M_len = 1;
    bVar11 = JsonLexer::Peek(lex,literal);
    if (bVar11) {
      piVar19 = &(lex->options_).recursion_depth;
      *piVar19 = *piVar19 + 1;
      *(undefined8 *)this = 1;
      return (Status)CONCAT71(extraout_var,bVar11);
    }
    local_108 = &lex->json_loc_;
    local_38 = (ulong)MVar14;
LAB_002bc7ea:
    SVar16 = JsonLexer::SkipToToken((JsonLexer *)this);
    if (*(long *)this != 1) {
      return (Status)SVar16.rep_;
    }
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_190);
    cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
    if ((cVar12 == '\"') ||
       (cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar12 == '\'')) {
      JsonLexer::ParseUtf8
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_f8.status_,lex);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)local_190,
                  (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_f8.status_);
    }
    else {
      if ((lex->options_).allow_legacy_syntax != true) {
        JsonLocation::Invalid((JsonLocation *)this,local_108,0xc,"expected \'\"\'");
        goto LAB_002bd340;
      }
      JsonLexer::ParseBareWord
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_f8.status_,lex);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)local_190,
                  (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_f8.status_);
    }
    this_00 = &local_f8;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&this_00->status_);
    *(undefined1 (*) [8])this = local_190;
    aVar21 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              )local_190;
    if (((ulong)local_190 & 1) == 0) {
      LOCK();
      *(int *)local_190 = *(int *)local_190 + 1;
      UNLOCK();
      aVar21.status_.rep_ = *(Status *)this;
    }
    if ((aVar21 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                    )0x1) || (JsonLexer::Expect((JsonLexer *)this,lex,1,":"), *(long *)this != 1))
    goto LAB_002bd340;
    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )local_190 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_190);
LAB_002bd79a:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
      goto LAB_002bd7a7;
    }
    if ((char)local_100 == '\0') {
LAB_002bc93d:
      psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_188);
      local_60.rep_ = (uintptr_t)(psVar17->_M_dataplus)._M_p;
      local_68 = (ZeroCopyInputStream *)psVar17->_M_string_length;
      if ((((local_68 == (ZeroCopyInputStream *)0x0) ||
           (*(char *)&((ZeroCopyBufferedStream *)local_60.rep_)->stream_ != '[')) ||
          (((undefined1 *)
           ((long)&((ZeroCopyBufferedStream *)(local_60.rep_ + -0x50))->outstanding_buffer_borrows_
           + 3))[(long)local_68] != ']')) &&
         (name._M_str = (char *)local_60.rep_, name._M_len = (size_t)local_68,
         pMVar18 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                   ResolverPool::Message::FindField(desc,name), SVar16.rep_ = local_60.rep_,
         pZVar10 = local_68, pMVar18 != (Msg<google::protobuf::json_internal::ParseProto3Type> *)0x0
         )) {
        pMVar29 = lex->path_;
        uVar1 = *(uint *)((pMVar18->stream_).impl_.buffer_end_ + 0x48);
        _Stack_f0._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName((Field)pMVar18);
        _Stack_f0._16_8_ = pZVar10;
        _Stack_f0._24_8_ = SVar16.rep_;
        uStack_d0 = 0xffffffff;
        iVar4._M_current =
             (pMVar29->components_).
             super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_f8.status_.rep_._0_4_ = uVar1;
        if (iVar4._M_current ==
            (pMVar29->components_).
            super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
          ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                    (&pMVar29->components_,iVar4,(Component *)&local_f8.status_);
        }
        else {
          ((iVar4._M_current)->field_name)._M_str = (char *)SVar16.rep_;
          *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(uStack_cc,0xffffffff);
          ((iVar4._M_current)->type_name)._M_str = (char *)_Stack_f0._8_8_;
          ((iVar4._M_current)->field_name)._M_len = (size_t)pZVar10;
          *(ulong *)iVar4._M_current = CONCAT44(local_f8.status_.rep_._4_4_,uVar1);
          ((iVar4._M_current)->type_name)._M_len = _Stack_f0._0_8_;
          ppCVar28 = &(pMVar29->components_).
                      super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar28 = *ppCVar28 + 1;
        }
        bVar11 = ParseProto3Type::HasParsed((Field)pMVar18,msg,(lex->options_).allow_legacy_syntax);
        if (bVar11) {
          JsonLexer::PeekKind((JsonLexer *)&local_f8.status_);
          lVar8 = CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_);
          uVar2 = _Stack_f0._0_4_;
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
                    ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)
                     &local_f8.status_);
          if ((lVar8 == 1) && (uVar2 == 6)) goto LAB_002bcb35;
          local_a0._0_8_ = &local_68;
          local_a0._8_8_ =
               absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_f8,"\'%s\' has already been set (either directly or as part of a oneof)"
                     ,0x41,local_a0);
          JsonLocation::Invalid
                    ((JsonLocation *)this,local_108,_Stack_f0._0_8_,
                     CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_));
          if ((void *)CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_) !=
              (void *)((long)&_Stack_f0 + 8)) {
            operator_delete((void *)CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_
                                            ),(ulong)(_Stack_f0._8_8_ + 1));
          }
        }
        else {
LAB_002bcb35:
          bVar11 = Proto3Type::IsMap((Field)pMVar18);
          if (bVar11) {
            ParseMap<google::protobuf::json_internal::ParseProto3Type>
                      ((JsonLexer *)this,
                       (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
          }
          else if ((*(int *)((pMVar18->stream_).impl_.buffer_end_ + 0x4c) == 3) &&
                  (((lex->options_).allow_legacy_syntax != true ||
                   (bVar11 = JsonLexer::Peek(lex,kArr), bVar11)))) {
            ParseArray<google::protobuf::json_internal::ParseProto3Type>
                      ((JsonLexer *)this,
                       (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
          }
          else {
            ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                      ((JsonLexer *)this,
                       (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
          }
        }
        ppCVar28 = &(pMVar29->components_).
                    super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar28 = *ppCVar28 + -1;
      }
      else if ((lex->options_).ignore_unknown_fields == false) {
        local_a0._0_8_ = &local_68;
        local_a0._8_8_ =
             absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                  (&local_f8,"no such field: \'%s\'",0x13,local_a0);
        JsonLocation::Invalid
                  ((JsonLocation *)this,local_108,_Stack_f0._0_8_,
                   CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_));
        if ((void *)CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_) !=
            (void *)((long)&_Stack_f0 + 8)) {
          operator_delete((void *)CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_),
                          (ulong)(_Stack_f0._8_8_ + 1));
        }
      }
      else {
        JsonLexer::SkipValue((JsonLexer *)this);
      }
    }
    else {
      bVar11 = json_internal::operator==((MaybeOwnedString *)auStack_188,(char (*) [6])"@type");
      if (bVar11) {
        JsonLexer::SkipValue((JsonLexer *)this);
      }
      else {
        if ((int)local_38 == 0) goto LAB_002bc93d;
        bVar11 = json_internal::operator==((MaybeOwnedString *)auStack_188,(char (*) [6])0x3d99d3);
        if (bVar11) {
          ParseMessage<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg,false);
        }
        else {
          JsonLocation::Invalid
                    ((JsonLocation *)this,local_108,0x37,
                     "fields in a well-known-typed Any must be @type or value");
        }
      }
    }
    if (*(long *)this != 1) {
LAB_002bd340:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_190);
      return (Status)extraout_RAX;
    }
    literal_00._M_str = ",";
    literal_00._M_len = 1;
    bVar11 = JsonLexer::Peek(lex,literal_00);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_190);
    literal_01._M_str = "}";
    literal_01._M_len = 1;
    bVar13 = JsonLexer::Peek(lex,literal_01);
    if (!bVar13) goto code_r0x002bcca0;
    piVar19 = &(lex->options_).recursion_depth;
    *piVar19 = *piVar19 + 1;
    if ((!bVar11) || ((lex->options_).allow_legacy_syntax != false)) {
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)lex;
    }
    pcVar24 = "expected \'}\'";
    goto LAB_002bcce6;
  }
  if (MVar14 != kValue) {
    if (MVar14 == kStruct) {
      SVar16 = ParseStructValue<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg)
      ;
      return (Status)SVar16.rep_;
    }
    if (MVar14 == kAny) {
      SVar16 = JsonLexer::SkipToToken((JsonLexer *)this);
      if (*(long *)this != 1) {
        return (Status)SVar16.rep_;
      }
      ZeroCopyBufferedStream::BeginMark((ZeroCopyBufferedStream *)&local_68);
      local_58 = (undefined4)(lex->json_loc_).offset;
      uStack_54 = *(undefined4 *)((long)&(lex->json_loc_).offset + 4);
      uStack_50 = (undefined4)(lex->json_loc_).line;
      uStack_4c = *(undefined4 *)((long)&(lex->json_loc_).line + 4);
      local_48 = (undefined4)(lex->json_loc_).col;
      uStack_44 = *(undefined4 *)((long)&(lex->json_loc_).col + 4);
      uStack_40 = *(undefined4 *)&(lex->json_loc_).path;
      uStack_3c = *(undefined4 *)((long)&(lex->json_loc_).path + 4);
      local_70 = false;
      SVar16 = JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
      if (*(long *)this == 1) {
        local_100 = &lex->json_loc_;
        iVar27 = (lex->options_).recursion_depth;
        if (iVar27 == 0) {
          SVar16 = JsonLocation::Invalid
                             ((JsonLocation *)this,local_100,0x22,
                              "JSON content was too deeply nested");
          if (*(long *)this != 1) goto LAB_002bd755;
        }
        else {
          (lex->options_).recursion_depth = iVar27 + -1;
          *(undefined8 *)this = 1;
        }
        literal_02._M_str = "}";
        literal_02._M_len = 1;
        bVar11 = JsonLexer::Peek(lex,literal_02);
        if (bVar11) {
          piVar19 = &(lex->options_).recursion_depth;
          *piVar19 = *piVar19 + 1;
LAB_002bcd9a:
          *(undefined8 *)this = 1;
        }
        else {
          this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     *)local_190;
          do {
            SVar16 = JsonLexer::SkipToToken((JsonLexer *)this);
            if (*(long *)this != 1) goto LAB_002bd755;
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&local_f8.status_);
            cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
            if ((cVar12 != '\"') &&
               (cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar12 != '\'')) {
              if ((lex->options_).allow_legacy_syntax == true) {
                JsonLexer::ParseBareWord
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&this_00->status_,lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_f8.status_,
                            (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&this_00->status_);
                goto LAB_002bce2c;
              }
              JsonLocation::Invalid((JsonLocation *)this,local_100,0xc,"expected \'\"\'");
LAB_002bd550:
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_f8.status_);
              SVar16.rep_ = extraout_RAX_01;
              goto LAB_002bd55d;
            }
            JsonLexer::ParseUtf8
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&this_00->status_,lex);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_f8.status_,
                        (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&this_00->status_);
LAB_002bce2c:
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&this_00->status_);
            piVar19 = (int *)CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_);
            *(int **)this = piVar19;
            if ((local_f8.status_.rep_._0_4_ & 1) == 0) {
              LOCK();
              *piVar19 = *piVar19 + 1;
              UNLOCK();
              piVar19 = *(int **)this;
            }
            if ((piVar19 != (int *)0x1) ||
               (JsonLexer::Expect((JsonLexer *)this,lex,1,":"), *(long *)this != 1))
            goto LAB_002bd550;
            if (CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_) != 1)
            goto LAB_002bd79a;
            bVar11 = json_internal::operator==
                               ((MaybeOwnedString *)&_Stack_f0._M_first,(char (*) [6])"@type");
            if (bVar11) {
              if (local_70 == true) {
                JsonLocation::Invalid((JsonLocation *)this,&local_c0,0x15,"repeated @type in Any");
              }
              else {
                JsonLexer::ParseUtf8
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&this_00->status_,lex);
                *(undefined1 (*) [8])this = local_190;
                if (((ulong)local_190 & 1) == 0) {
                  LOCK();
                  *(int *)local_190 = *(int *)local_190 + 1;
                  UNLOCK();
                }
                if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )local_190 ==
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x1) {
                  std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator=
                            ((optional<google::protobuf::json_internal::MaybeOwnedString> *)local_a0
                             ,(MaybeOwnedString *)auStack_188);
                  *(undefined8 *)this = 1;
                }
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 *)&this_00->status_);
              }
            }
            else {
              JsonLexer::SkipValue((JsonLexer *)this);
            }
            if (*(long *)this != 1) goto LAB_002bd550;
            literal_03._M_str = ",";
            literal_03._M_len = 1;
            bVar11 = JsonLexer::Peek(lex,literal_03);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_f8.status_);
            literal_04._M_str = "}";
            literal_04._M_len = 1;
            bVar13 = JsonLexer::Peek(lex,literal_04);
            if (bVar13) {
              piVar19 = &(lex->options_).recursion_depth;
              *piVar19 = *piVar19 + 1;
              if ((!bVar11) || ((lex->options_).allow_legacy_syntax != false)) goto LAB_002bcd9a;
              pcVar25 = "expected \'}\'";
              goto LAB_002bd51d;
            }
          } while (bVar11);
          pcVar25 = "expected \',\'";
LAB_002bd51d:
          SVar16 = JsonLocation::Invalid((JsonLocation *)this,local_100,0xc,pcVar25);
LAB_002bd55d:
          if (*(long *)this != 1) goto LAB_002bd755;
        }
        sVar7 = *(size_t *)(local_60.rep_ + 0x38);
        iVar27 = *(int *)(local_60.rep_ + 0x4c);
        if (iVar27 == 0) {
          *(size_t *)(local_60.rep_ + 0x40) = sVar7;
        }
        local_190 = (undefined1  [8])local_60.rep_;
        auStack_188._8_8_ = (char *)(sVar7 - (long)local_68);
        auStack_188._0_8_ = local_68;
        auStack_188[0x18] = 1;
        auStack_188._32_4_ = (undefined4)local_60.rep_;
        auStack_188._36_4_ = (undefined4)(local_60.rep_ >> 0x20);
        *(int *)(local_60.rep_ + 0x4c) = iVar27 + 2;
        if (iVar27 == -1) {
          *(size_t *)(local_60.rep_ + 0x40) = sVar7;
        }
        ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_60.rep_);
        sVar31 = MaybeOwnedString::AsView((MaybeOwnedString *)local_190);
        if ((ZeroCopyBufferedStream *)CONCAT44(auStack_188._36_4_,auStack_188._32_4_) !=
            (ZeroCopyBufferedStream *)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer
                    ((ZeroCopyBufferedStream *)CONCAT44(auStack_188._36_4_,auStack_188._32_4_));
          auStack_188._32_4_ = 0;
          auStack_188._36_4_ = 0;
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
          ::_S_vtable._M_arr[(byte)auStack_188[0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)&local_f8.status_,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                    *)local_190);
        io::ArrayInputStream::ArrayInputStream
                  ((ArrayInputStream *)&local_f8.status_,sVar31._M_str,(int)sVar31._M_len,-1);
        local_118 = lex->path_;
        auStack_188._68_4_ = 0;
        auStack_188._0_16_ = ZEXT816(0);
        auStack_188._16_8_ = (pointer)0x0;
        auStack_188[0x18] = 0;
        auStack_188._25_7_ = 0;
        auStack_188._32_4_ = 0;
        auStack_188._36_4_ = 0;
        auStack_188[0x28] = false;
        auStack_188._48_8_ = 0;
        auStack_188._56_8_ = 0;
        auStack_188[0x40] = false;
        auStack_188._72_8_ = *(undefined8 *)&lex->options_;
        auStack_188[0x50] = (lex->options_).allow_legacy_syntax;
        auStack_188._81_3_ = *(undefined3 *)&(lex->options_).field_0x9;
        local_130 = local_58;
        uStack_12c = uStack_54;
        uStack_128 = uStack_50;
        uStack_124 = uStack_4c;
        local_120 = CONCAT44(uStack_44,local_48);
        local_190 = (undefined1  [8])&local_f8;
        local_110 = local_118;
        if (local_70 == false) {
          if ((lex->options_).allow_legacy_syntax == false) {
            SVar16 = JsonLocation::Invalid
                               ((JsonLocation *)this,&local_58,0x14,"missing @type in Any");
          }
          else {
            SVar16 = JsonLexer::
                     VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&)_1_>
                               ((JsonLexer *)this,
                                (LocationWith<google::protobuf::json_internal::Mark> *)local_190);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              *(undefined8 *)this = 1;
              SVar16.rep_ = extraout_RAX_02;
            }
          }
        }
        else {
          pFVar22 = Proto3Type::MustHaveField(desc,1);
          sVar31 = MaybeOwnedString::AsView((MaybeOwnedString *)local_a0);
          x_00._M_str = pcVar24;
          x_00._M_len = (size_t)sVar31._M_str;
          ParseProto3Type::SetString
                    ((ParseProto3Type *)pFVar22,(Field)msg,(Msg *)sVar31._M_len,x_00);
          pFVar22 = Proto3Type::MustHaveField(desc,2);
          psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)local_a0);
          SVar16 = ParseProto3Type::
                   NewDynamic<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)_1_>
                             ((ParseProto3Type *)this,pFVar22,psVar17,msg,(JsonLexer *)local_190);
        }
        if ((pointer)auStack_188._16_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_188._16_8_,
                          CONCAT44(auStack_188._36_4_,auStack_188._32_4_) - auStack_188._16_8_);
          SVar16.rep_ = extraout_RAX_03;
        }
      }
LAB_002bd755:
      if (local_70 == true) {
        std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
                   local_a0);
        SVar16.rep_ = extraout_RAX_04;
      }
      if ((ZeroCopyBufferedStream *)local_60.rep_ == (ZeroCopyBufferedStream *)0x0) {
        return (Status)SVar16.rep_;
      }
      ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_60.rep_);
      return (Status)extraout_RAX_05;
    }
    JsonLexer::PeekKind((JsonLexer *)local_190);
    auVar9 = local_190;
    uVar2 = auStack_188._0_4_;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)local_190);
    if ((((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )auVar9 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) || (uVar2 != 0)) || ((lex->options_).allow_legacy_syntax == false)) {
      switch(MVar14) {
      case kWrapper:
        pMVar18 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                  Proto3Type::MustHaveField(desc,1);
        SVar16 = ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                           ((JsonLexer *)this,
                            (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
        return (Status)SVar16.rep_;
      case kList:
        SVar16 = ParseListValue<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg)
        ;
        return (Status)SVar16.rep_;
      case kTimestamp:
        SVar16 = ParseTimestamp<google::protobuf::json_internal::ParseProto3Type>
                           ((JsonLexer *)this,
                            (Desc<google::protobuf::json_internal::ParseProto3Type> *)lex,
                            (Msg<google::protobuf::json_internal::ParseProto3Type> *)desc);
        return (Status)SVar16.rep_;
      case kDuration:
        SVar16 = ParseDuration<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg);
        return (Status)SVar16.rep_;
      case kFieldMask:
        SVar16 = ParseFieldMask<google::protobuf::json_internal::ParseProto3Type>
                           ((JsonLexer *)this,
                            (Desc<google::protobuf::json_internal::ParseProto3Type> *)lex,
                            (Msg<google::protobuf::json_internal::ParseProto3Type> *)desc);
        return (Status)SVar16.rep_;
      }
    }
    goto switchD_002bc764_caseD_3;
  }
  this_00 = &local_f8;
  SVar30 = JsonLexer::PeekKind((JsonLexer *)&this_00->status_);
  uVar23 = SVar30.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_;
  piVar19 = (int *)CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_);
  *(int **)this = piVar19;
  if ((local_f8.status_.rep_._0_4_ & 1) == 0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
    piVar19 = *(int **)this;
  }
  if (piVar19 != (int *)0x1) goto LAB_002bd4e6;
  if (CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_) != 1) {
LAB_002bd7a7:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
LAB_002bd7b4:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_f8.status_);
    absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_190);
LAB_002bd7cb:
    absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_190);
LAB_002bd7d5:
    uVar23 = absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_190);
    *(long *)(&this_00->status_ + 1) = *(long *)(&this_00->status_ + 1) + -0x30;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_f8.status_);
    _Unwind_Resume(uVar23);
  }
  switch(_Stack_f0._0_4_) {
  case 0:
    pMVar20 = (Msg *)Proto3Type::MustHaveField(desc,5,uVar23);
    pMVar29 = lex->path_;
    puVar5 = (pMVar20->stream_).impl_.buffer_end_;
    puVar26 = (undefined8 *)(*(ulong *)(puVar5 + 0x28) & 0xfffffffffffffffc);
    pcVar24 = (char *)*puVar26;
    pcVar6 = (pointer)puVar26[1];
    uVar2 = *(undefined4 *)(puVar5 + 0x48);
    auStack_188._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName((Field)pMVar20);
    local_190._0_4_ = uVar2;
    auStack_188[0x18] = SUB81(pcVar24,0);
    auStack_188._25_7_ = (undefined7)((ulong)pcVar24 >> 8);
    auStack_188._32_4_ = 0xffffffff;
    iVar4._M_current =
         (pMVar29->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_188._16_8_ = pcVar6;
    if (iVar4._M_current ==
        (pMVar29->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar29->components_,iVar4,(Component *)local_190);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar24;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_188._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_188._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar4._M_current = local_190;
      ((iVar4._M_current)->type_name)._M_len = auStack_188._0_8_;
      ppCVar28 = &(pMVar29->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar28 = *ppCVar28 + 1;
    }
    ParseProto3Type::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&,auto:2&)_1_>
              ((Field)this,pMVar20,(anon_class_8_1_ba1d5d7f)msg);
    goto LAB_002bd48a;
  case 1:
    pMVar20 = (Msg *)Proto3Type::MustHaveField(desc,6,uVar23);
    pMVar29 = lex->path_;
    puVar5 = (pMVar20->stream_).impl_.buffer_end_;
    puVar26 = (undefined8 *)(*(ulong *)(puVar5 + 0x28) & 0xfffffffffffffffc);
    pcVar24 = (char *)*puVar26;
    pcVar6 = (pointer)puVar26[1];
    uVar2 = *(undefined4 *)(puVar5 + 0x48);
    auStack_188._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName((Field)pMVar20);
    local_190._0_4_ = uVar2;
    auStack_188[0x18] = SUB81(pcVar24,0);
    auStack_188._25_7_ = (undefined7)((ulong)pcVar24 >> 8);
    auStack_188._32_4_ = 0xffffffff;
    iVar4._M_current =
         (pMVar29->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_188._16_8_ = pcVar6;
    if (iVar4._M_current ==
        (pMVar29->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar29->components_,iVar4,(Component *)local_190);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar24;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_188._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_188._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar4._M_current = local_190;
      ((iVar4._M_current)->type_name)._M_len = auStack_188._0_8_;
      ppCVar28 = &(pMVar29->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar28 = *ppCVar28 + 1;
    }
    ParseProto3Type::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&,auto:2&)_2_>
              ((Field)this,pMVar20,(anon_class_8_1_ba1d5d7f)msg);
LAB_002bd48a:
    ppCVar28 = &(pMVar29->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar28 = *ppCVar28 + -1;
    goto LAB_002bd4e6;
  case 2:
    pFVar22 = Proto3Type::MustHaveField(desc,3,uVar23);
    pMVar29 = lex->path_;
    puVar26 = (undefined8 *)
              ((ulong)(pFVar22->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar25 = (char *)*puVar26;
    pcVar6 = (pointer)puVar26[1];
    uVar1 = (pFVar22->raw_->field_0)._impl_.kind_;
    this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               *)(ulong)uVar1;
    auStack_188._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar22);
    local_190._0_4_ = uVar1;
    auStack_188[0x18] = SUB81(pcVar25,0);
    auStack_188._25_7_ = (undefined7)((ulong)pcVar25 >> 8);
    auStack_188._32_4_ = 0xffffffff;
    ppCVar28 = &(pMVar29->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar29->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_188._16_8_ = pcVar6;
    if (iVar4._M_current ==
        (pMVar29->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar29->components_,iVar4,(Component *)local_190);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar25;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_188._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_188._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar4._M_current = local_190;
      ((iVar4._M_current)->type_name)._M_len = auStack_188._0_8_;
      *ppCVar28 = *ppCVar28 + 1;
    }
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_190,lex);
    *(undefined1 (*) [8])this = local_190;
    aVar21 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              )local_190;
    if (((ulong)local_190 & 1) == 0) {
      LOCK();
      *(int *)local_190 = *(int *)local_190 + 1;
      UNLOCK();
      aVar21.status_.rep_ = *(Status *)this;
    }
    if (aVar21 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                   )0x1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )local_190 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_188);
        x._M_str = pcVar24;
        x._M_len = (size_t)(psVar17->_M_dataplus)._M_p;
        ParseProto3Type::SetString
                  ((ParseProto3Type *)pFVar22,(Field)msg,(Msg *)psVar17->_M_string_length,x);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_190);
        goto LAB_002bd4d3;
      }
      goto LAB_002bd7cb;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_190);
    break;
  case 3:
    pFVar22 = Proto3Type::MustHaveField(desc,2,uVar23);
    pMVar29 = lex->path_;
    puVar26 = (undefined8 *)
              ((ulong)(pFVar22->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar24 = (char *)*puVar26;
    pcVar6 = (pointer)puVar26[1];
    uVar1 = (pFVar22->raw_->field_0)._impl_.kind_;
    this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               *)(ulong)uVar1;
    auStack_188._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar22);
    local_190._0_4_ = uVar1;
    auStack_188[0x18] = SUB81(pcVar24,0);
    auStack_188._25_7_ = (undefined7)((ulong)pcVar24 >> 8);
    auStack_188._32_4_ = 0xffffffff;
    ppCVar28 = &(pMVar29->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar29->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_188._16_8_ = pcVar6;
    if (iVar4._M_current ==
        (pMVar29->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar29->components_,iVar4,(Component *)local_190);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar24;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_188._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_188._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar6;
      *(undefined1 (*) [8])iVar4._M_current = local_190;
      ((iVar4._M_current)->type_name)._M_len = auStack_188._0_8_;
      *ppCVar28 = *ppCVar28 + 1;
    }
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_190,lex);
    *(undefined1 (*) [8])this = local_190;
    aVar21 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
              )local_190;
    if (((ulong)local_190 & 1) == 0) {
      LOCK();
      *(int *)local_190 = *(int *)local_190 + 1;
      UNLOCK();
      aVar21.status_.rep_ = *(Status *)this;
    }
    if (aVar21 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                   )0x1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )local_190 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) goto LAB_002bd7d5;
      ParseProto3Type::SetDouble(pFVar22,msg,(double)auStack_188._0_8_);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_190);
LAB_002bd4d3:
      *ppCVar28 = *ppCVar28 + -1;
      goto switchD_002bc672_default;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_190);
    break;
  case 4:
  case 5:
    pFVar22 = Proto3Type::MustHaveField(desc,4,uVar23);
    pMVar29 = lex->path_;
    puVar26 = (undefined8 *)
              ((ulong)(pFVar22->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar24 = (char *)*puVar26;
    pcVar6 = (pointer)puVar26[1];
    TVar3 = (pFVar22->raw_->field_0)._impl_.kind_;
    this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               *)(ulong)TVar3;
    auStack_188._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar22);
    local_190._0_4_ = TVar3;
    auStack_188[0x18] = SUB81(pcVar24,0);
    auStack_188._25_7_ = (undefined7)((ulong)pcVar24 >> 8);
    auStack_188._32_4_ = 0xffffffff;
    ppCVar28 = &(pMVar29->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar29->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_188._16_8_ = pcVar6;
    if (iVar4._M_current ==
        (pMVar29->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar29->components_,iVar4,(Component *)local_190);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar24;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_188._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_188._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar6;
      (iVar4._M_current)->type = TVar3;
      *(undefined4 *)&(iVar4._M_current)->field_0x4 = local_190._4_4_;
      *(undefined4 *)&((iVar4._M_current)->type_name)._M_len = auStack_188._0_4_;
      *(undefined4 *)((long)&((iVar4._M_current)->type_name)._M_len + 4) = auStack_188._4_4_;
      *ppCVar28 = *ppCVar28 + 1;
    }
    if (CONCAT44(local_f8.status_.rep_._4_4_,local_f8.status_.rep_._0_4_) != 1) goto LAB_002bd7b4;
    if (_Stack_f0._0_4_ == 4) {
      JsonLexer::Expect((JsonLexer *)this,lex,4,"true");
    }
    else {
      JsonLexer::Expect((JsonLexer *)this,lex,5,"false");
    }
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto3Type::SetBool(pFVar22,msg,_Stack_f0._0_4_ == 4);
      goto LAB_002bd4d3;
    }
    break;
  case 6:
    pFVar22 = Proto3Type::MustHaveField(desc,1,uVar23);
    pMVar29 = lex->path_;
    puVar26 = (undefined8 *)
              ((ulong)(pFVar22->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar24 = (char *)*puVar26;
    pcVar6 = (pointer)puVar26[1];
    TVar3 = (pFVar22->raw_->field_0)._impl_.kind_;
    auStack_188._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar22);
    local_190._0_4_ = TVar3;
    auStack_188[0x18] = SUB81(pcVar24,0);
    auStack_188._25_7_ = (undefined7)((ulong)pcVar24 >> 8);
    auStack_188._32_4_ = 0xffffffff;
    ppCVar28 = &(pMVar29->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar29->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_188._16_8_ = pcVar6;
    if (iVar4._M_current ==
        (pMVar29->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar29->components_,iVar4,(Component *)local_190);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar24;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_188._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_188._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar6;
      (iVar4._M_current)->type = TVar3;
      *(undefined4 *)&(iVar4._M_current)->field_0x4 = local_190._4_4_;
      *(undefined4 *)&((iVar4._M_current)->type_name)._M_len = auStack_188._0_4_;
      *(undefined4 *)((long)&((iVar4._M_current)->type_name)._M_len + 4) = auStack_188._4_4_;
      *ppCVar28 = *ppCVar28 + 1;
    }
    JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto3Type::SetEnum(pFVar22,msg,0);
      goto LAB_002bd4d3;
    }
    break;
  default:
switchD_002bc672_default:
    *(undefined8 *)this = 1;
    goto LAB_002bd4e6;
  }
  *ppCVar28 = *ppCVar28 + -1;
LAB_002bd4e6:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_f8.status_);
  return (Status)extraout_RAX_00;
code_r0x002bcca0:
  if (!bVar11) {
    pcVar24 = "expected \',\'";
LAB_002bcce6:
    SVar16 = JsonLocation::Invalid((JsonLocation *)this,local_108,0xc,pcVar24);
    return (Status)SVar16.rep_;
  }
  goto LAB_002bc7ea;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}